

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

char * __thiscall cmsys::RegExpCompile::regbranch(RegExpCompile *this,int *flagp)

{
  char cVar1;
  uint uVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *val;
  char *p;
  undefined8 uStack_38;
  int flags;
  
  *flagp = 0;
  uStack_38 = in_RAX;
  pcVar3 = regnode(this,'\x06');
  p = (char *)0x0;
  while (((cVar1 = *this->regparse, cVar1 != '\0' && (cVar1 != ')')) && (cVar1 != '|'))) {
    val = regpiece(this,&flags);
    if (val == (char *)0x0) {
      return (char *)0x0;
    }
    uVar2 = flags & 1U | *flagp;
    *flagp = uVar2;
    if (p == (char *)0x0) {
      *flagp = uVar2 | flags & 4U;
      p = val;
    }
    else {
      regtail(p,val);
      p = val;
    }
  }
  if (p == (char *)0x0) {
    regnode(this,'\t');
  }
  return pcVar3;
}

Assistant:

char* RegExpCompile::regbranch(int* flagp)
{
  char* ret;
  char* chain;
  char* latest;
  int flags;

  *flagp = WORST; // Tentatively.

  ret = regnode(BRANCH);
  chain = nullptr;
  while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
    latest = regpiece(&flags);
    if (latest == nullptr)
      return (nullptr);
    *flagp |= flags & HASWIDTH;
    if (chain == nullptr) // First piece.
      *flagp |= flags & SPSTART;
    else
      regtail(chain, latest);
    chain = latest;
  }
  if (chain == nullptr) // Loop ran zero times.
    regnode(NOTHING);

  return (ret);
}